

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O1

zt_log_ty * zt_log_logger(zt_log_ty *log)

{
  zt_log_level zVar1;
  zt_log_level in_ESI;
  zt_log_ty *pzVar2;
  
  if (log_default_ptr != (zt_log_ty *)0x0 || log != (zt_log_ty *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&log_mutex);
    pzVar2 = log_default_ptr;
    log_default_ptr = log;
    pthread_mutex_unlock((pthread_mutex_t *)&log_mutex);
    return pzVar2;
  }
  if (log_default_ptr == (zt_log_ty *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&log_mutex);
    if (log_default_ptr == (zt_log_ty *)0x0) {
      pzVar2 = (zt_log_ty *)0x2;
      log_default_ptr = zt_log_stderr(2);
      if (log_default_ptr == (zt_log_ty *)0x0) {
        zt_log_get_logger_cold_1();
        if ((pzVar2 == (zt_log_ty *)0x0) &&
           (pzVar2 = zt_log_get_logger(), pzVar2 == (zt_log_ty *)0x0)) {
          return (zt_log_ty *)0x0;
        }
        zVar1 = pzVar2->level;
        pzVar2->level = in_ESI;
        return (zt_log_ty *)(ulong)zVar1;
      }
      zt_atexit(log_atexit,log_default_ptr);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&log_mutex);
  }
  return log_default_ptr;
}

Assistant:

zt_log_ty *
zt_log_logger(zt_log_ty * log) {
    /* STATES:
     * log == NULL AND default == NULL           : create a new logger
     * log == NULL AND default == <logger>       : replace the current logger with log (NULL)
     * log == <logger> AND default == NULL       : replace the default logger with log
     * log == <logger> AND default == <logger>   : replace the default logger with log
     */

    /* if log is NULL and there is no default get one */
    if (log == NULL && log_default_ptr == NULL) {
        return zt_log_get_logger();
    }

    return zt_log_set_logger(log);
}